

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

vm_obj_id_t __thiscall CVmObjVector::create_copy(CVmObjVector *this,vm_val_t *self_val)

{
  ushort uVar1;
  char *pcVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  vm_obj_id_t obj_id;
  CVmObjVector *this_00;
  
  pvVar5 = sp_;
  uVar4 = *(undefined4 *)&self_val->field_0x4;
  aVar3 = self_val->val;
  sp_ = sp_ + 1;
  pvVar5->typ = self_val->typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar4;
  pvVar5->val = aVar3;
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,1,0);
  this_00 = (CVmObjVector *)CVmObject::operator_new(0x10,obj_id);
  uVar1 = *(ushort *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  (this_00->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_0032eac8;
  alloc_vector(this_00,(ulong)uVar1);
  pcVar2 = (this_00->super_CVmObjCollection).super_CVmObject.ext_;
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  *(undefined2 *)((this_00->super_CVmObjCollection).super_CVmObject.ext_ + 2) =
       *(undefined2 *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  pcVar2 = (this->super_CVmObjCollection).super_CVmObject.ext_;
  memcpy((this_00->super_CVmObjCollection).super_CVmObject.ext_ + 4,pcVar2 + 4,
         (ulong)*(ushort *)(pcVar2 + 2) * 5);
  sp_ = sp_ + -1;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjVector::create_copy(VMG_ const vm_val_t *self_val)
{
    vm_obj_id_t new_id;
    CVmObjVector *new_vec;
    
    /* save the original object on the stack for gc protection */
    G_stk->push(self_val);

    /* create a new vector with the same parameters as this one */
    new_id = vm_new_id(vmg_ FALSE, TRUE, FALSE);
    new_vec = new (vmg_ new_id) CVmObjVector(vmg_ get_allocated_count());
    new_vec->set_element_count(get_element_count());

    /* copy the elements from the old vector to the new vector */
    memcpy(new_vec->get_element_ptr(0), get_element_ptr(0),
           calc_alloc_ele(get_element_count()));

    /* done with the gc protection - discard it */
    G_stk->discard(1);

    /* return the new vector's object ID */
    return new_id;
}